

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O1

optional<tinyusdz::value::TimeSamples> * __thiscall
tinyusdz::crate::CrateValue::get_value<tinyusdz::value::TimeSamples>
          (optional<tinyusdz::value::TimeSamples> *__return_storage_ptr__,CrateValue *this)

{
  optional<tinyusdz::value::TimeSamples> local_38;
  
  tinyusdz::value::Value::get_value<tinyusdz::value::TimeSamples>(&local_38,&this->value_,false);
  __return_storage_ptr__->has_value_ = local_38.has_value_;
  if (local_38.has_value_ == true) {
    *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
         local_38.contained.data.__align;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_38.contained._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_38.contained._16_8_;
    local_38.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_38.contained._8_8_ = 0;
    local_38.contained._16_8_ = 0;
    *(undefined1 *)((long)&__return_storage_ptr__->contained + 0x18) = local_38.contained._24_1_;
    ::std::
    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
    ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               *)&local_38.contained);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }